

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

bool __thiscall
Assimp::Ogre::OgreXmlSerializer::CurrentNodeNameEquals(OgreXmlSerializer *this,string *name)

{
  int iVar1;
  
  iVar1 = ASSIMP_stricmp(&this->m_currentNodeName,name);
  return iVar1 == 0;
}

Assistant:

bool OgreXmlSerializer::CurrentNodeNameEquals(const std::string &name) const
{
    return (ASSIMP_stricmp(m_currentNodeName, name) == 0);
}